

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O2

void null_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                 JSAMPARRAY output_buf,int num_rows)

{
  uint uVar1;
  JSAMPROW pJVar2;
  JSAMPROW pJVar3;
  JSAMPROW pJVar4;
  ulong uVar5;
  JSAMPROW pJVar6;
  ulong uVar7;
  ulong uVar8;
  JSAMPROW pJVar9;
  ulong uVar10;
  
  uVar1 = cinfo->num_components;
  uVar5 = (ulong)cinfo->output_width;
  if ((long)(int)uVar1 == 3) {
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      pJVar2 = (*input_buf)[input_row];
      pJVar9 = input_buf[1][input_row];
      pJVar3 = input_buf[2][input_row];
      input_row = input_row + 1;
      pJVar6 = *output_buf;
      for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
        *pJVar6 = pJVar2[uVar8];
        pJVar6[1] = pJVar9[uVar8];
        pJVar6[2] = pJVar3[uVar8];
        pJVar6 = pJVar6 + 3;
      }
      output_buf = output_buf + 1;
    }
  }
  else if (uVar1 == 4) {
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      pJVar2 = (*input_buf)[input_row];
      pJVar9 = input_buf[1][input_row];
      pJVar3 = input_buf[2][input_row];
      pJVar6 = input_buf[3][input_row];
      input_row = input_row + 1;
      pJVar4 = *output_buf;
      for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
        pJVar4[uVar8 * 4] = pJVar2[uVar8];
        pJVar4[uVar8 * 4 + 1] = pJVar9[uVar8];
        pJVar4[uVar8 * 4 + 2] = pJVar3[uVar8];
        pJVar4[uVar8 * 4 + 3] = pJVar6[uVar8];
      }
      output_buf = output_buf + 1;
    }
  }
  else {
    uVar8 = 0;
    if (0 < (int)uVar1) {
      uVar8 = (ulong)uVar1;
    }
    while (0 < num_rows) {
      num_rows = num_rows + -1;
      for (uVar7 = 0; uVar7 != uVar8; uVar7 = uVar7 + 1) {
        pJVar2 = input_buf[uVar7][input_row];
        pJVar9 = *output_buf + uVar7;
        for (uVar10 = 0; uVar5 != uVar10; uVar10 = uVar10 + 1) {
          *pJVar9 = pJVar2[uVar10];
          pJVar9 = pJVar9 + (int)uVar1;
        }
      }
      output_buf = output_buf + 1;
      input_row = input_row + 1;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
null_convert(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
             JDIMENSION input_row, JSAMPARRAY output_buf, int num_rows)
{
  register JSAMPROW inptr, inptr0, inptr1, inptr2, inptr3, outptr;
  register JDIMENSION col;
  register int num_components = cinfo->num_components;
  JDIMENSION num_cols = cinfo->output_width;
  int ci;

  if (num_components == 3) {
    while (--num_rows >= 0) {
      inptr0 = input_buf[0][input_row];
      inptr1 = input_buf[1][input_row];
      inptr2 = input_buf[2][input_row];
      input_row++;
      outptr = *output_buf++;
      for (col = 0; col < num_cols; col++) {
        *outptr++ = inptr0[col];
        *outptr++ = inptr1[col];
        *outptr++ = inptr2[col];
      }
    }
  } else if (num_components == 4) {
    while (--num_rows >= 0) {
      inptr0 = input_buf[0][input_row];
      inptr1 = input_buf[1][input_row];
      inptr2 = input_buf[2][input_row];
      inptr3 = input_buf[3][input_row];
      input_row++;
      outptr = *output_buf++;
      for (col = 0; col < num_cols; col++) {
        *outptr++ = inptr0[col];
        *outptr++ = inptr1[col];
        *outptr++ = inptr2[col];
        *outptr++ = inptr3[col];
      }
    }
  } else {
    while (--num_rows >= 0) {
      for (ci = 0; ci < num_components; ci++) {
        inptr = input_buf[ci][input_row];
        outptr = *output_buf;
        for (col = 0; col < num_cols; col++) {
          outptr[ci] = inptr[col];
          outptr += num_components;
        }
      }
      output_buf++;
      input_row++;
    }
  }
}